

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

uint fl_utf8toa(char *src,uint srclen,char *dst,uint dstlen)

{
  wchar_t wVar1;
  wchar_t local_54;
  uint local_50;
  wchar_t len_1;
  uint ucs;
  wchar_t len;
  uchar c;
  char *pcStack_40;
  uint count;
  char *e;
  char *p;
  char *pcStack_28;
  uint dstlen_local;
  char *dst_local;
  char *pcStack_18;
  uint srclen_local;
  char *src_local;
  
  pcStack_40 = src + srclen;
  len = L'\0';
  wVar1 = len;
  e = src;
  p._4_4_ = dstlen;
  pcStack_28 = dst;
  dst_local._4_4_ = srclen;
  pcStack_18 = src;
  if (dstlen != 0) {
    do {
      len = wVar1;
      if (pcStack_40 <= e) {
        pcStack_28[(uint)len] = '\0';
        return len;
      }
      ucs._3_1_ = *e;
      if (ucs._3_1_ < 0xc2) {
        pcStack_28[(uint)len] = ucs._3_1_;
        e = e + 1;
      }
      else {
        local_50 = fl_utf8decode(e,pcStack_40,&len_1);
        e = e + len_1;
        if (local_50 < 0x100) {
          pcStack_28[(uint)len] = (char)local_50;
        }
        else {
          pcStack_28[(uint)len] = '?';
        }
      }
      wVar1 = len + L'\x01';
    } while ((uint)wVar1 < (uint)p._4_4_);
    pcStack_28[(uint)len] = '\0';
    len = wVar1;
  }
  while (e < pcStack_40) {
    if (((int)*e & 0x80U) == 0) {
      e = e + 1;
    }
    else {
      fl_utf8decode(e,pcStack_40,&local_54);
      e = e + local_54;
    }
    len = len + L'\x01';
  }
  return len;
}

Assistant:

unsigned fl_utf8toa(const char* src, unsigned srclen,
		 char* dst, unsigned dstlen)
{
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned char c;
    if (p >= e) {dst[count] = 0; return count;}
    c = *(const unsigned char*)p;
    if (c < 0xC2) { /* ascii or bad code */
      dst[count] = c;
      p++;
    } else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      if (ucs < 0x100) dst[count] = ucs;
      else dst[count] = '?';
    }
    if (++count >= dstlen) {dst[count-1] = 0; break;}
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    if (!(*p & 0x80)) p++;
    else {
      int len;
      fl_utf8decode(p,e,&len);
      p += len;
    }
    ++count;
  }
  return count;
}